

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O2

void accumulate_suite::test_overfull(void)

{
  int iVar1;
  initializer_list<int> input;
  iterator iVar2;
  iterator iVar3;
  undefined4 local_7c;
  int local_78 [4];
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_78[0] = 0xb;
  local_78[1] = 0x16;
  local_78[2] = 0x21;
  local_78[3] = 0x2c;
  input._M_len = 4;
  input._M_array = local_78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar1 = std::accumulate<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int>
                    (iVar2,iVar3,0);
  local_7c = 0x6e;
  local_78[0] = iVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","11 + 22 + 33 + 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1d,"void accumulate_suite::test_overfull()",local_78,&local_7c);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_78[0] = std::
                accumulate<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int>
                          (iVar2,iVar3,0);
  local_7c = 0x9a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::accumulate(span.begin(), span.end(), 0)","22 + 33 + 44 + 55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x1f,"void accumulate_suite::test_overfull()",local_78,&local_7c);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 11 + 22 + 33 + 44);
    span.push_back(55);
    BOOST_TEST_EQ(std::accumulate(span.begin(), span.end(), 0), 22 + 33 + 44 + 55);
}